

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlTextWriterWriteDTDEntity(void)

{
  int iVar1;
  int iVar2;
  int val;
  xmlTextWriterPtr val_00;
  xmlChar *val_01;
  xmlChar *val_02;
  xmlChar *val_03;
  xmlChar *val_04;
  xmlChar *val_05;
  int local_7c;
  int n_content;
  xmlChar *content;
  int n_ndataid;
  xmlChar *ndataid;
  int n_sysid;
  xmlChar *sysid;
  int n_pubid;
  xmlChar *pubid;
  int n_name;
  xmlChar *name;
  int n_pe;
  int pe;
  int n_writer;
  xmlTextWriterPtr writer;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (n_pe = 0; n_pe < 2; n_pe = n_pe + 1) {
    for (name._4_4_ = 0; (int)name._4_4_ < 4; name._4_4_ = name._4_4_ + 1) {
      for (pubid._4_4_ = 0; (int)pubid._4_4_ < 5; pubid._4_4_ = pubid._4_4_ + 1) {
        for (sysid._4_4_ = 0; (int)sysid._4_4_ < 5; sysid._4_4_ = sysid._4_4_ + 1) {
          for (ndataid._4_4_ = 0; (int)ndataid._4_4_ < 5; ndataid._4_4_ = ndataid._4_4_ + 1) {
            for (content._4_4_ = 0; (int)content._4_4_ < 5; content._4_4_ = content._4_4_ + 1) {
              for (local_7c = 0; local_7c < 5; local_7c = local_7c + 1) {
                iVar1 = xmlMemBlocks();
                val_00 = gen_xmlTextWriterPtr(n_pe,0);
                iVar2 = gen_int(name._4_4_,1);
                val_01 = gen_const_xmlChar_ptr(pubid._4_4_,2);
                val_02 = gen_const_xmlChar_ptr(sysid._4_4_,3);
                val_03 = gen_const_xmlChar_ptr(ndataid._4_4_,4);
                val_04 = gen_const_xmlChar_ptr(content._4_4_,5);
                val_05 = gen_const_xmlChar_ptr(local_7c,6);
                val = xmlTextWriterWriteDTDEntity(val_00,iVar2,val_01,val_02,val_03,val_04,val_05);
                desret_int(val);
                call_tests = call_tests + 1;
                des_xmlTextWriterPtr(n_pe,val_00,0);
                des_int(name._4_4_,iVar2,1);
                des_const_xmlChar_ptr(pubid._4_4_,val_01,2);
                des_const_xmlChar_ptr(sysid._4_4_,val_02,3);
                des_const_xmlChar_ptr(ndataid._4_4_,val_03,4);
                des_const_xmlChar_ptr(content._4_4_,val_04,5);
                des_const_xmlChar_ptr(local_7c,val_05,6);
                xmlResetLastError();
                iVar2 = xmlMemBlocks();
                if (iVar1 != iVar2) {
                  iVar2 = xmlMemBlocks();
                  printf("Leak of %d blocks found in xmlTextWriterWriteDTDEntity",
                         (ulong)(uint)(iVar2 - iVar1));
                  ret_val = ret_val + 1;
                  printf(" %d",(ulong)(uint)n_pe);
                  printf(" %d",(ulong)name._4_4_);
                  printf(" %d",(ulong)pubid._4_4_);
                  printf(" %d",(ulong)sysid._4_4_);
                  printf(" %d",(ulong)ndataid._4_4_);
                  printf(" %d",(ulong)content._4_4_);
                  printf(" %d");
                  printf("\n");
                }
              }
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlTextWriterWriteDTDEntity(void) {
    int test_ret = 0;

#if defined(LIBXML_WRITER_ENABLED)
    int mem_base;
    int ret_val;
    xmlTextWriterPtr writer; /* the xmlTextWriterPtr */
    int n_writer;
    int pe; /* TRUE if this is a parameter entity, FALSE if not */
    int n_pe;
    const xmlChar * name; /* the name of the DTD entity */
    int n_name;
    const xmlChar * pubid; /* the public identifier, which is an alternative to the system identifier */
    int n_pubid;
    const xmlChar * sysid; /* the system identifier, which is the URI of the DTD */
    int n_sysid;
    const xmlChar * ndataid; /* the xml notation name. */
    int n_ndataid;
    const xmlChar * content; /* content of the entity */
    int n_content;

    for (n_writer = 0;n_writer < gen_nb_xmlTextWriterPtr;n_writer++) {
    for (n_pe = 0;n_pe < gen_nb_int;n_pe++) {
    for (n_name = 0;n_name < gen_nb_const_xmlChar_ptr;n_name++) {
    for (n_pubid = 0;n_pubid < gen_nb_const_xmlChar_ptr;n_pubid++) {
    for (n_sysid = 0;n_sysid < gen_nb_const_xmlChar_ptr;n_sysid++) {
    for (n_ndataid = 0;n_ndataid < gen_nb_const_xmlChar_ptr;n_ndataid++) {
    for (n_content = 0;n_content < gen_nb_const_xmlChar_ptr;n_content++) {
        mem_base = xmlMemBlocks();
        writer = gen_xmlTextWriterPtr(n_writer, 0);
        pe = gen_int(n_pe, 1);
        name = gen_const_xmlChar_ptr(n_name, 2);
        pubid = gen_const_xmlChar_ptr(n_pubid, 3);
        sysid = gen_const_xmlChar_ptr(n_sysid, 4);
        ndataid = gen_const_xmlChar_ptr(n_ndataid, 5);
        content = gen_const_xmlChar_ptr(n_content, 6);

        ret_val = xmlTextWriterWriteDTDEntity(writer, pe, name, pubid, sysid, ndataid, content);
        desret_int(ret_val);
        call_tests++;
        des_xmlTextWriterPtr(n_writer, writer, 0);
        des_int(n_pe, pe, 1);
        des_const_xmlChar_ptr(n_name, name, 2);
        des_const_xmlChar_ptr(n_pubid, pubid, 3);
        des_const_xmlChar_ptr(n_sysid, sysid, 4);
        des_const_xmlChar_ptr(n_ndataid, ndataid, 5);
        des_const_xmlChar_ptr(n_content, content, 6);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlTextWriterWriteDTDEntity",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_writer);
            printf(" %d", n_pe);
            printf(" %d", n_name);
            printf(" %d", n_pubid);
            printf(" %d", n_sysid);
            printf(" %d", n_ndataid);
            printf(" %d", n_content);
            printf("\n");
        }
    }
    }
    }
    }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}